

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkQueue.c
# Opt level: O1

_Bool queueDone(queue *q)

{
  ulong uVar1;
  ulong uVar2;
  chunk *pcVar3;
  ulong uVar4;
  
  pcVar3 = createChunk();
  pcVar3->action = '\x05';
  uVar1 = q->capacity;
  uVar2 = q->size;
  if (uVar2 != uVar1) {
    q->size = uVar2 + 1;
    uVar4 = (q->tail + 1U) % uVar1;
    q->tail = uVar4;
    q->elements[uVar4] = pcVar3;
  }
  return uVar2 != uVar1;
}

Assistant:

inline bool queueDone(queue* q)
{
    chunk* done = createChunk();
    done->action = DONE;

    if (enque(done, q)) { return true; }
  
    pdebug("!!!!!queueDone Failed!!!!!");
    return false;
}